

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2.h
# Opt level: O0

uint __thiscall cpyp::Corpus::get_or_add_word(Corpus *this,string *word)

{
  mapped_type *pmVar1;
  mapped_type *this_00;
  string *in_RSI;
  long in_RDI;
  uint *id;
  
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)this,word);
  if (*pmVar1 == 0) {
    *pmVar1 = *(mapped_type *)(in_RDI + 0x174);
    *(int *)(in_RDI + 0x174) = *(int *)(in_RDI + 0x174) + 1;
    this_00 = std::
              map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)this,(key_type_conflict *)word);
    std::__cxx11::string::operator=((string *)this_00,in_RSI);
    *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(in_RDI + 0x174);
  }
  return *pmVar1;
}

Assistant:

inline unsigned get_or_add_word(const std::string& word) {
  unsigned& id = wordsToInt[word];
  if (id == 0) {
    id = max;
    ++max;
    intToWords[id] = word;
    nwords = max;
  }
  return id;
}